

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazyARA.cpp
# Opt level: O2

void __thiscall LazyARAPlanner::putStateInHeap(LazyARAPlanner *this,LazyARAState *state)

{
  LazyARAState *local_30;
  CKey local_28;
  CKey local_18;
  
  local_30 = state;
  if (state->iteration_closed == this->search_iteration) {
    if (state->in_incons == false) {
      std::vector<LazyARAState_*,_std::allocator<LazyARAState_*>_>::push_back
                (&this->incons,&local_30);
      local_30->in_incons = true;
    }
  }
  else {
    local_28.key[0] = (long)((int)((double)state->h * this->eps) + state->g);
    if ((state->super_AbstractSearchState).heapindex == 0) {
      local_28.key[1] = 0;
      CHeap::insertheap(&this->heap,&state->super_AbstractSearchState,&local_28);
    }
    else {
      local_18.key[1] = 0;
      local_18.key[0] = local_28.key[0];
      CHeap::updateheap(&this->heap,&state->super_AbstractSearchState,&local_18);
    }
  }
  return;
}

Assistant:

void LazyARAPlanner::putStateInHeap(LazyARAState* state)
{
    // we only allow one expansion per search iteration
    // so insert into heap if not closed yet
    if (state->iteration_closed != search_iteration) {
        SBPL_DEBUG("put state %d in open with state->g=%d and state->isTrueCost=%d\n", state->id, state->g, state->isTrueCost);
        CKey key;
        key.key[0] = state->g + int(eps * state->h);
        // if the state is already in the heap, just update its priority
        if (state->heapindex != 0) {
            heap.updateheap(state, key);
        }
        else { // otherwise add it to the heap
            heap.insertheap(state, key);
        }
    }
    // if the state has already been expanded once for this iteration then add
    // it to the incons list so we can keep track of states that we know we have
    // better costs for
    else if (!state->in_incons) {
        SBPL_DEBUG("put state %d in incons with state->g=%d and state->isTrueCost=%d\n", state->id, state->g, state->isTrueCost);
        incons.push_back(state);
        state->in_incons = true;
    }
}